

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O1

int Dau_DsdNormalizeCompare(char *pStr,int *pMarks,int i,int j)

{
  char cVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  
  pcVar4 = pStr + pMarks[i];
  pcVar5 = pStr + pMarks[j];
  pcVar6 = pStr + pMarks[(long)j + 1];
  bVar8 = pMarks[i] < pMarks[(long)i + 1];
  bVar7 = pMarks[j] < pMarks[(long)j + 1];
  if (bVar8 && bVar7) {
    do {
      cVar1 = *pcVar4;
      if ((byte)(cVar1 + 0x9fU) < 0x1a) {
        cVar2 = *pcVar5;
        if ((byte)(cVar2 + 0x9fU) < 0x1a) {
          if (cVar1 < cVar2) goto LAB_004fe673;
          if (cVar2 < cVar1) {
            return 1;
          }
        }
        else {
          pcVar4 = pcVar4 + -1;
        }
      }
      else {
        pcVar5 = pcVar5 + -1;
      }
      pcVar4 = pcVar4 + 1;
      pcVar5 = pcVar5 + 1;
      bVar7 = pcVar5 < pcVar6;
      bVar8 = pcVar4 < pStr + pMarks[(long)i + 1];
    } while ((bVar8) && (pcVar5 < pcVar6));
  }
  if ((!bVar8) && (!bVar7)) {
    __assert_fail("pStr1 < pLimit1 || pStr2 < pLimit2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                  ,0xb5,"int Dau_DsdNormalizeCompare(char *, int *, int, int)");
  }
  if (pcVar4 == pStr + pMarks[(long)i + 1]) {
LAB_004fe673:
    iVar3 = -1;
  }
  else {
    iVar3 = 1;
    if (pcVar5 != pcVar6) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                    ,0xba,"int Dau_DsdNormalizeCompare(char *, int *, int, int)");
    }
  }
  return iVar3;
}

Assistant:

int Dau_DsdNormalizeCompare( char * pStr, int * pMarks, int i, int j )
{
    char * pStr1 = pStr + pMarks[i];
    char * pStr2 = pStr + pMarks[j];
    char * pLimit1 = pStr + pMarks[i+1];
    char * pLimit2 = pStr + pMarks[j+1];
    for ( ; pStr1 < pLimit1 && pStr2 < pLimit2; pStr1++, pStr2++ )
    {
        if ( !(*pStr1 >= 'a' &&  *pStr1 <= 'z') )
        {
            pStr2--;
            continue;
        }
        if ( !(*pStr2 >= 'a' &&  *pStr2 <= 'z') )
        {
            pStr1--;
            continue;
        }
        if ( *pStr1 < *pStr2 )
            return -1;
        if ( *pStr1 > *pStr2 )
            return 1;
    }
    assert( pStr1 < pLimit1 || pStr2 < pLimit2 );
    if ( pStr1 == pLimit1 )
        return -1;
    if ( pStr2 == pLimit2 )
        return 1;
    assert( 0 );
    return 0;
}